

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_validate_utf8_chunk(nn_sws *self)

{
  int iVar1;
  size_t local_28;
  size_t len;
  uint8_t *puStack_18;
  int code_point_len;
  uint8_t *pos;
  nn_sws *self_local;
  
  local_28 = self->inmsg_current_chunk_len;
  puStack_18 = self->inmsg_current_chunk_buf;
  if (self->utf8_code_pt_fragment_len == 0) {
LAB_00140d01:
    if (3 < self->utf8_code_pt_fragment_len) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x272);
      fflush(_stderr);
      nn_err_abort();
    }
    do {
      while( true ) {
        if (local_28 == 0) {
          self->utf8_code_pt_fragment_len = 0;
          memset(self->utf8_code_pt_fragment,0,4);
          if (self->is_final_frame != 0) {
            self->instate = 4;
            nn_pipebase_received(&self->pipebase);
            return;
          }
          nn_sws_recv_hdr(self);
          return;
        }
        iVar1 = nn_utf8_code_point(puStack_18,local_28);
        if (iVar1 < 1) break;
        if (local_28 < (ulong)(long)iVar1) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","len >= code_point_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                  ,0x27a);
          fflush(_stderr);
          nn_err_abort();
        }
        local_28 = local_28 - (long)iVar1;
        puStack_18 = puStack_18 + iVar1;
      }
      if (iVar1 == -2) {
        self->utf8_code_pt_fragment_len = 0;
        memset(self->utf8_code_pt_fragment,0,4);
        nn_sws_fail_conn(self,0x3ef,"Invalid UTF-8 code point in payload.");
        return;
      }
    } while (iVar1 != -1);
    if (3 < local_28) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","len < NN_SWS_UTF8_MAX_CODEPOINT_LEN",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x288);
      fflush(_stderr);
      nn_err_abort();
    }
    self->utf8_code_pt_fragment_len = local_28;
    memcpy(self->utf8_code_pt_fragment,puStack_18,local_28);
    if (self->is_final_frame == 0) {
      nn_sws_recv_hdr(self);
    }
    else {
      nn_sws_fail_conn(self,0x3ef,"Truncated UTF-8 payload with invalid code point.");
    }
  }
  else {
    if (3 < self->utf8_code_pt_fragment_len) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "self->utf8_code_pt_fragment_len < NN_SWS_UTF8_MAX_CODEPOINT_LEN",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x24c);
      fflush(_stderr);
      nn_err_abort();
    }
    do {
      if (local_28 == 0) goto LAB_00140d01;
      self->utf8_code_pt_fragment[self->utf8_code_pt_fragment_len] = *puStack_18;
      self->utf8_code_pt_fragment_len = self->utf8_code_pt_fragment_len + 1;
      puStack_18 = puStack_18 + 1;
      local_28 = local_28 - 1;
      iVar1 = nn_utf8_code_point(self->utf8_code_pt_fragment,self->utf8_code_pt_fragment_len);
      if (0 < iVar1) goto LAB_00140d01;
      if (iVar1 == -2) {
        nn_sws_fail_conn(self,0x3ef,"Invalid UTF-8 code point split on previous frame.");
        return;
      }
    } while (iVar1 != -1);
    if (self->is_final_frame == 0) {
      nn_sws_recv_hdr(self);
    }
    else {
      nn_sws_fail_conn(self,0x3ef,"Truncated UTF-8 payload with invalid code point.");
    }
  }
  return;
}

Assistant:

static void nn_sws_validate_utf8_chunk (struct nn_sws *self)
{
    uint8_t *pos;
    int code_point_len;
    size_t len;

    len = self->inmsg_current_chunk_len;
    pos = self->inmsg_current_chunk_buf;

    /*  For chunked transfers, it's possible that a previous chunk was cut
        intra-code point. That partially-validated code point is reassembled
        with the beginning of the current chunk and checked. */
    if (self->utf8_code_pt_fragment_len) {

        nn_assert (self->utf8_code_pt_fragment_len <
            NN_SWS_UTF8_MAX_CODEPOINT_LEN);

        /*  Keep adding octets from fresh buffer to previous code point
            fragment to check for validity. */
        while (len > 0) {
            self->utf8_code_pt_fragment [self->utf8_code_pt_fragment_len] = *pos;
            self->utf8_code_pt_fragment_len++;
            pos++;
            len--;

            code_point_len = nn_utf8_code_point (self->utf8_code_pt_fragment,
                self->utf8_code_pt_fragment_len);
            
            if (code_point_len > 0) {
                /*  Valid code point found; continue validating. */
                break;
            }
            else if (code_point_len == NN_SWS_UTF8_INVALID) {
                nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                    "Invalid UTF-8 code point split on previous frame.");
                return;
            }
            else if (code_point_len == NN_SWS_UTF8_FRAGMENT) {
                if (self->is_final_frame) {
                    nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                        "Truncated UTF-8 payload with invalid code point.");
                    return;
                }
                else {
                    /*  This chunk is well-formed; now recv the next chunk. */
                    nn_sws_recv_hdr (self);
                    return;
                }
            }
        }
    }

    if (self->utf8_code_pt_fragment_len >= NN_SWS_UTF8_MAX_CODEPOINT_LEN)
        nn_assert (0);

    while (len > 0) {

        code_point_len = nn_utf8_code_point (pos, len);

        if (code_point_len > 0) {
            /*  Valid code point found; continue validating. */
            nn_assert (len >= code_point_len);
            len -= code_point_len;
            pos += code_point_len;
            continue;
        }
        else if (code_point_len == NN_SWS_UTF8_INVALID) {
            self->utf8_code_pt_fragment_len = 0;
            memset (self->utf8_code_pt_fragment, 0,
                NN_SWS_UTF8_MAX_CODEPOINT_LEN);
            nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                "Invalid UTF-8 code point in payload.");
            return;
        }
        else if (code_point_len == NN_SWS_UTF8_FRAGMENT) {
            nn_assert (len < NN_SWS_UTF8_MAX_CODEPOINT_LEN);
            self->utf8_code_pt_fragment_len = len;
            memcpy (self->utf8_code_pt_fragment, pos, len);
            if (self->is_final_frame) {
                nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                    "Truncated UTF-8 payload with invalid code point.");
            }
            else {
                /*  Previous frame ended in the middle of a code point;
                    receive more. */
                nn_sws_recv_hdr (self);
            }
            return;
        }
    }

    /*  Entire buffer is well-formed. */
    nn_assert (len == 0);

    self->utf8_code_pt_fragment_len = 0;
    memset (self->utf8_code_pt_fragment, 0, NN_SWS_UTF8_MAX_CODEPOINT_LEN);

    if (self->is_final_frame) {
        self->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
        nn_pipebase_received (&self->pipebase);
    }
    else {
        nn_sws_recv_hdr (self);
    }

    return;
}